

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void sync_dec_workers(AV1Decoder *pbi,int num_workers)

{
  int iVar1;
  AVxWorkerInterface *pAVar2;
  ulong uVar3;
  long lVar4;
  int corrupted;
  int local_2c;
  
  uVar3 = (ulong)(uint)num_workers;
  pAVar2 = aom_get_worker_interface();
  local_2c = 0;
  lVar4 = uVar3 * 0x38;
  while( true ) {
    if ((int)uVar3 < 1) break;
    iVar1 = (*pAVar2->sync)((AVxWorker *)((long)&pbi->tile_workers[-1].impl_ + lVar4));
    aom_merge_corrupted_flag(&local_2c,(uint)(iVar1 == 0));
    uVar3 = (ulong)((int)uVar3 - 1);
    lVar4 = lVar4 + -0x38;
  }
  (pbi->dcb).corrupted = local_2c;
  return;
}

Assistant:

static inline void sync_dec_workers(AV1Decoder *pbi, int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int corrupted = 0;

  for (int worker_idx = num_workers; worker_idx > 0; --worker_idx) {
    AVxWorker *const worker = &pbi->tile_workers[worker_idx - 1];
    aom_merge_corrupted_flag(&corrupted, !winterface->sync(worker));
  }

  pbi->dcb.corrupted = corrupted;
}